

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::int_writer<int,fmt::v5::basic_format_specs<char>>::bin_writer<1>::operator()
          (bin_writer<1> *this,truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *it
          )

{
  undefined8 *in_RSI;
  bool in_stack_0000000f;
  int in_stack_00000010;
  uint in_stack_00000014;
  truncating_iterator<char_*,_std::integral_constant<bool,_false>_> in_stack_00000020;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined1 local_18;
  
  internal::
  format_uint<1u,char,fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,unsigned_int>
            (in_stack_00000020,in_stack_00000014,in_stack_00000010,in_stack_0000000f);
  *in_RSI = local_30;
  in_RSI[1] = local_28;
  in_RSI[2] = local_20;
  *(undefined1 *)(in_RSI + 3) = local_18;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_uint<BITS, char_type>(it, abs_value, num_digits);
      }